

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupTopAnd_iter(Gia_Man_t *p,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  int *__ptr;
  undefined8 uVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  Vec_Int_t *__ptr_00;
  int *piVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar6;
  void *__s;
  Gia_Man_t *pGVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  Vec_Int_t *p_01;
  long lVar11;
  int iVar12;
  size_t __size;
  long lVar13;
  
  __ptr_00 = (Vec_Int_t *)malloc(0x10);
  __ptr_00->nCap = 1000;
  __ptr_00->nSize = 0;
  piVar5 = (int *)malloc(4000);
  __ptr_00->pArray = piVar5;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p_00->pArray = piVar5;
  pVVar6 = p->vCos;
  if (pVVar6->nSize < 1) {
LAB_001e8e06:
    if (fVerbose != 0) {
      puts("The AIG cannot be decomposed using AND-decomposition.");
    }
    if (__ptr_00->pArray != (int *)0x0) {
      free(__ptr_00->pArray);
    }
    free(__ptr_00);
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
    }
LAB_001e8e3e:
    free(p_00);
    pGVar7 = Gia_ManDupNormalize(p,0);
    return pGVar7;
  }
  lVar11 = 0;
  do {
    iVar9 = pVVar6->pArray[lVar11];
    if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_001e8f98;
    if (p->pObjs == (Gia_Obj_t *)0x0) break;
    pGVar3 = p->pObjs + iVar9;
    uVar4 = (uint)*(undefined8 *)pGVar3;
    if ((~*(ulong *)(pGVar3 + -(ulong)(uVar4 & 0x1fffffff)) & 0x1fffffff1fffffff) != 0) {
      iVar9 = iVar9 - (uVar4 & 0x1fffffff);
      pVVar6 = __ptr_00;
      if ((uVar4 >> 0x1d & 1) != 0) {
        if (iVar9 < 0) goto LAB_001e8fd6;
        iVar9 = iVar9 * 2 + 1;
        pVVar6 = p_00;
      }
      Vec_IntPush(pVVar6,iVar9);
    }
    lVar11 = lVar11 + 1;
    pVVar6 = p->vCos;
  } while (lVar11 < pVVar6->nSize);
  if (__ptr_00->nSize == 0) goto LAB_001e8e06;
  if (0 < __ptr_00->nSize) {
    lVar11 = 0;
    do {
      iVar9 = __ptr_00->pArray[lVar11];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_001e8f98;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar9;
      uVar4 = (uint)*(ulong *)pGVar3;
      pVVar6 = p_00;
      if ((uVar4 & 0x9fffffff) == 0x9fffffff) {
        iVar9 = iVar9 * 2;
      }
      else {
        if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                        ,0xa18,"Gia_Man_t *Gia_ManDupTopAnd_iter(Gia_Man_t *, int)");
        }
        iVar9 = iVar9 - (uVar4 & 0x1fffffff);
        p_01 = __ptr_00;
        if ((uVar4 >> 0x1d & 1) != 0) {
          if (iVar9 < 0) {
LAB_001e8fd6:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          iVar9 = iVar9 * 2 + 1;
          p_01 = p_00;
        }
        Vec_IntPush(p_01,iVar9);
        pGVar1 = p->pObjs;
        uVar4 = (uint)(*(ulong *)pGVar3 >> 0x20);
        if ((*(ulong *)pGVar3 >> 0x3d & 1) == 0) {
          if ((pGVar3 < pGVar1) || (pGVar1 + p->nObjs <= pGVar3)) {
LAB_001e8ff5:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar9 = (int)((ulong)((long)pGVar3 - (long)pGVar1) >> 2) * -0x55555555 -
                  (uVar4 & 0x1fffffff);
          pVVar6 = __ptr_00;
        }
        else {
          if ((pGVar3 < pGVar1) || (pGVar1 + p->nObjs <= pGVar3)) goto LAB_001e8ff5;
          iVar9 = (int)((ulong)((long)pGVar3 - (long)pGVar1) >> 2) * -0x55555555 -
                  (uVar4 & 0x1fffffff);
          if (iVar9 < 0) goto LAB_001e8fd6;
          iVar9 = iVar9 * 2 + 1;
        }
      }
      Vec_IntPush(pVVar6,iVar9);
      lVar11 = lVar11 + 1;
    } while (lVar11 < __ptr_00->nSize);
  }
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  iVar9 = p->nObjs;
  __size = (size_t)iVar9;
  piVar5 = (int *)malloc(__size * 4);
  memset(piVar5,0xff,__size * 4);
  __s = malloc(__size);
  memset(__s,0xff,__size);
  iVar12 = p_00->nSize;
  if ((long)iVar12 < 1) {
    p_00->nSize = 0;
    iVar8 = 0;
    if (iVar9 < 1) goto LAB_001e8ee1;
  }
  else {
    __ptr = p_00->pArray;
    lVar11 = 0;
    iVar8 = 0;
    do {
      uVar4 = __ptr[lVar11];
      if ((int)uVar4 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar10 = (ulong)(uVar4 >> 1);
      if (iVar9 <= (int)(uVar4 >> 1)) {
LAB_001e8f98:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar2 = *(undefined8 *)(p->pObjs + uVar10);
      if (((uint)uVar2 & 0x9fffffff) == 0x9fffffff) {
        piVar5[(uint)((ulong)uVar2 >> 0x20) & 0x1fffffff] = ~uVar4 & 1;
        iVar8 = iVar8 + 1;
      }
      if (*(byte *)((long)__s + uVar10) < 2) {
        if ((uVar4 & 1) != (uint)*(byte *)((long)__s + uVar10)) {
          puts("Problem is trivially UNSAT.");
          if (piVar5 != (int *)0x0) {
            free(piVar5);
          }
          free(__s);
          free(__ptr);
          goto LAB_001e8e3e;
        }
      }
      else {
        *(byte *)((long)__s + uVar10) = (byte)uVar4 & 1;
      }
      lVar11 = lVar11 + 1;
    } while (iVar12 != lVar11);
    p_00->nSize = 0;
  }
  lVar11 = 0;
  iVar12 = 0;
  lVar13 = 0;
  do {
    pGVar3 = p->pObjs;
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if (((*(uint *)(&pGVar3->field_0x0 + lVar11) & 0x9fffffff) != 0x9fffffff) &&
       (*(byte *)((long)__s + lVar13) < 2)) {
      Vec_IntPush(p_00,(uint)*(byte *)((long)__s + lVar13) + iVar12);
      iVar9 = p->nObjs;
    }
    lVar13 = lVar13 + 1;
    iVar12 = iVar12 + 2;
    lVar11 = lVar11 + 0xc;
  } while (lVar13 < iVar9);
LAB_001e8ee1:
  if (fVerbose != 0) {
    printf("Detected %6d AND leaves and %6d CI leaves.\n",(ulong)(uint)p_00->nSize);
  }
  if (iVar8 == 0) {
    pGVar7 = Gia_ManDupDfsLitArray(p,p_00);
  }
  else {
    pGVar7 = Gia_ManDupDfsCiMap(p,piVar5,p_00);
  }
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManDupTopAnd_iter( Gia_Man_t * p, int fVerbose )  
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vFront, * vLeaves;
    int i, iLit, iObjId, nCiLits, * pCi2Lit;
    char * pVar2Val;
    // collect the frontier
    vFront = Vec_IntAlloc( 1000 );
    vLeaves = Vec_IntAlloc( 1000 );
    Gia_ManForEachCo( p, pObj, i )
    {
        if ( Gia_ObjIsConst0( Gia_ObjFanin0(pObj) ) )
            continue;
        if ( Gia_ObjFaninC0(pObj) )
            Vec_IntPush( vLeaves, Gia_ObjFaninLit0p(p, pObj) );
        else
            Vec_IntPush( vFront, Gia_ObjFaninId0p(p, pObj) );
    }
    if ( Vec_IntSize(vFront) == 0 )
    {
        if ( fVerbose )
            printf( "The AIG cannot be decomposed using AND-decomposition.\n" );
        Vec_IntFree( vFront );
        Vec_IntFree( vLeaves );
        return Gia_ManDupNormalize( p, 0 );
    }
    // expand the frontier
    Gia_ManForEachObjVec( vFront, p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            Vec_IntPush( vLeaves, Abc_Var2Lit( Gia_ObjId(p, pObj), 0 ) );
            continue;
        }
        assert( Gia_ObjIsAnd(pObj) );
        if ( Gia_ObjFaninC0(pObj) )
            Vec_IntPush( vLeaves, Gia_ObjFaninLit0p(p, pObj) );
        else
            Vec_IntPush( vFront, Gia_ObjFaninId0p(p, pObj) );
        if ( Gia_ObjFaninC1(pObj) )
            Vec_IntPush( vLeaves, Gia_ObjFaninLit1p(p, pObj) );
        else
            Vec_IntPush( vFront, Gia_ObjFaninId1p(p, pObj) );
    }
    Vec_IntFree( vFront );
    // sort the literals
    nCiLits = 0;
    pCi2Lit = ABC_FALLOC( int, Gia_ManObjNum(p) );
    pVar2Val = ABC_FALLOC( char, Gia_ManObjNum(p) );
    Vec_IntForEachEntry( vLeaves, iLit, i )
    {
        iObjId = Abc_Lit2Var(iLit);
        pObj = Gia_ManObj(p, iObjId);
        if ( Gia_ObjIsCi(pObj) )
        {
            pCi2Lit[Gia_ObjCioId(pObj)] = !Abc_LitIsCompl(iLit);
            nCiLits++;
        }
        if ( pVar2Val[iObjId] != 0 && pVar2Val[iObjId] != 1 )
            pVar2Val[iObjId] = Abc_LitIsCompl(iLit);
        else if ( pVar2Val[iObjId] != Abc_LitIsCompl(iLit) )
            break;
    }
    if ( i < Vec_IntSize(vLeaves) )
    {
        printf( "Problem is trivially UNSAT.\n" );
        ABC_FREE( pCi2Lit );
        ABC_FREE( pVar2Val );
        Vec_IntFree( vLeaves );
        return Gia_ManDupNormalize( p, 0 );
    }
    // create array of input literals
    Vec_IntClear( vLeaves );
    Gia_ManForEachObj( p, pObj, i )
        if ( !Gia_ObjIsCi(pObj) && (pVar2Val[i] == 0 || pVar2Val[i] == 1) )
            Vec_IntPush( vLeaves, Abc_Var2Lit(i, pVar2Val[i]) );
    if ( fVerbose )
        printf( "Detected %6d AND leaves and %6d CI leaves.\n", Vec_IntSize(vLeaves), nCiLits );
    // create the input map
    if ( nCiLits == 0 )
        pNew = Gia_ManDupDfsLitArray( p, vLeaves );
    else
        pNew = Gia_ManDupDfsCiMap( p, pCi2Lit, vLeaves );
    ABC_FREE( pCi2Lit );
    ABC_FREE( pVar2Val );
    Vec_IntFree( vLeaves );
    return pNew;
}